

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void __thiscall Log::Log(Log *this,string *_name)

{
  int iVar1;
  char *__file;
  sem_t *psVar2;
  void *p;
  string *_name_local;
  Log *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)_name);
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = open(__file,0x442,0x1a4);
  this->fd = iVar1;
  psVar2 = (sem_t *)mmap((void *)0x0,0x20,3,0x21,-1,0);
  if (psVar2 == (sem_t *)0xffffffffffffffff) {
    perror("mmap error");
    exit(1);
  }
  this->sem = psVar2;
  sem_init((sem_t *)this->sem,1,1);
  return;
}

Assistant:

Log::Log(const std::string &_name):name(_name) {
    //打开用于记录日志的文件
    fd = open(name.c_str(), O_RDWR | O_CREAT | O_APPEND, 0644);
    //在mmap上创建信号量用于进行文件的写操作，防止时序竞态
    void *p = mmap(nullptr, sizeof(sem_t), PROT_READ | PROT_WRITE, MAP_SHARED | MAP_ANON, -1, 0);;
    if (p == MAP_FAILED) {
        perror("mmap error");
        exit(1);
    }
    sem = reinterpret_cast<sem_t *>(p);
    sem_init(sem, PTHREAD_PROCESS_SHARED, 1);  //互斥量
}